

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O1

void __thiscall pmx::PmxBone::Read(PmxBone *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  PmxIkLink *pPVar2;
  uint8_t in_CL;
  PmxIkLink *pPVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->bone_english_name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::istream::read((char *)stream,(long)this->position);
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->parent_index = iVar1;
  std::istream::read((char *)stream,(long)&this->level);
  std::istream::read((char *)stream,(long)&this->bone_flag);
  if ((this->bone_flag & 1) == 0) {
    std::istream::read((char *)stream,(long)this->offset);
  }
  else {
    iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
    this->target_index = iVar1;
  }
  if ((this->bone_flag & 0x300) != 0) {
    iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
    this->grant_parent_index = iVar1;
    std::istream::read((char *)stream,(long)&this->grant_weight);
  }
  if ((this->bone_flag & 0x400) != 0) {
    std::istream::read((char *)stream,(long)this->lock_axis_orientation);
  }
  if ((this->bone_flag & 0x800) != 0) {
    std::istream::read((char *)stream,(long)this->local_axis_x_orientation);
    std::istream::read((char *)stream,(long)this->local_axis_y_orientation);
  }
  if ((this->bone_flag & 0x2000) != 0) {
    std::istream::read((char *)stream,(long)&this->key);
  }
  if ((this->bone_flag & 0x20) != 0) {
    iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
    this->ik_target_bone_index = iVar1;
    std::istream::read((char *)stream,(long)&this->ik_loop);
    std::istream::read((char *)stream,(long)&this->ik_loop_angle_limit);
    std::istream::read((char *)stream,(long)&this->ik_link_count);
    lVar4 = (long)this->ik_link_count;
    uVar5 = 0xffffffffffffffff;
    if (-1 < lVar4) {
      uVar5 = lVar4 * 0x20;
    }
    pPVar2 = (PmxIkLink *)operator_new__(uVar5);
    if (lVar4 != 0) {
      pPVar3 = pPVar2;
      do {
        pPVar3->link_target = 0;
        pPVar3->angle_lock = '\0';
        pPVar3->max_radian[0] = 0.0;
        pPVar3->max_radian[1] = 0.0;
        *(undefined8 *)(pPVar3->max_radian + 2) = 0;
        pPVar3->min_radian[1] = 0.0;
        pPVar3->min_radian[2] = 0.0;
        pPVar3 = pPVar3 + 1;
      } while (pPVar3 != pPVar2 + lVar4);
    }
    pPVar3 = (this->ik_links)._M_t.
             super___uniq_ptr_impl<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxIkLink_*,_std::default_delete<pmx::PmxIkLink[]>_>.
             super__Head_base<0UL,_pmx::PmxIkLink_*,_false>._M_head_impl;
    (this->ik_links)._M_t.
    super___uniq_ptr_impl<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxIkLink_*,_std::default_delete<pmx::PmxIkLink[]>_>.
    super__Head_base<0UL,_pmx::PmxIkLink_*,_false>._M_head_impl = pPVar2;
    if (pPVar3 != (PmxIkLink *)0x0) {
      operator_delete__(pPVar3);
    }
    if (0 < this->ik_link_count) {
      lVar4 = 0;
      lVar6 = 0;
      do {
        PmxIkLink::Read((PmxIkLink *)
                        ((long)((this->ik_links)._M_t.
                                super___uniq_ptr_impl<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pmx::PmxIkLink_*,_std::default_delete<pmx::PmxIkLink[]>_>
                                .super__Head_base<0UL,_pmx::PmxIkLink_*,_false>._M_head_impl)->
                               max_radian + lVar4 + -8),stream,setting);
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x20;
      } while (lVar6 < this->ik_link_count);
    }
  }
  return;
}

Assistant:

void PmxBone::Read(std::istream *stream, PmxSetting *setting)
	{
		this->bone_name = std::move(ReadString(stream, setting->encoding));
		this->bone_english_name = std::move(ReadString(stream, setting->encoding));
		stream->read((char*) this->position, sizeof(float) * 3);
		this->parent_index = ReadIndex(stream, setting->bone_index_size);
		stream->read((char*) &this->level, sizeof(int));
		stream->read((char*) &this->bone_flag, sizeof(uint16_t));
		if (this->bone_flag & 0x0001) {
			this->target_index = ReadIndex(stream, setting->bone_index_size);
		}
		else {
			stream->read((char*)this->offset, sizeof(float) * 3);
		}
		if (this->bone_flag & (0x0100 | 0x0200)) {
			this->grant_parent_index = ReadIndex(stream, setting->bone_index_size);
			stream->read((char*) &this->grant_weight, sizeof(float));
		}
		if (this->bone_flag & 0x0400) {
			stream->read((char*)this->lock_axis_orientation, sizeof(float) * 3);
		}
		if (this->bone_flag & 0x0800) {
			stream->read((char*)this->local_axis_x_orientation, sizeof(float) * 3);
			stream->read((char*)this->local_axis_y_orientation, sizeof(float) * 3);
		}
		if (this->bone_flag & 0x2000) {
			stream->read((char*) &this->key, sizeof(int));
		}
		if (this->bone_flag & 0x0020) {
			this->ik_target_bone_index = ReadIndex(stream, setting->bone_index_size);
			stream->read((char*) &ik_loop, sizeof(int));
			stream->read((char*) &ik_loop_angle_limit, sizeof(float));
			stream->read((char*) &ik_link_count, sizeof(int));
			this->ik_links = std::make_unique<PmxIkLink []>(ik_link_count);
			for (int i = 0; i < ik_link_count; i++) {
				ik_links[i].Read(stream, setting);
			}
		}
	}